

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
initial_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  QLoggingCategory *pQVar1;
  char *category;
  QDebug *this;
  QMessageLogger local_58;
  QDebug local_38 [14];
  bool local_2a;
  char local_29;
  bool qt_category_enabled;
  int *piStack_28;
  char c;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  piStack_28 = error;
  error_local = (int *)f;
  f_local = (ifstream *)conf;
  conf_local = (MetaConfiguration *)__return_storage_ptr__;
  clear_empty(f);
  local_29 = std::istream::peek();
  pQVar1 = parser();
  local_2a = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_2a != false) {
    pQVar1 = parser();
    category = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger(&local_58,(char *)0x0,0,(char *)0x0,category);
    QMessageLogger::debug();
    this = QDebug::operator<<(local_38,"Peeking");
    QDebug::operator<<(this,local_29);
    QDebug::~QDebug(local_38);
    local_2a = false;
  }
  if (local_29 == -1) {
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::function(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else if (local_29 == '#') {
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,state_include);
  }
  else if (local_29 == '/') {
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,guess_documentation_state);
  }
  else if (local_29 == '{') {
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,begin_class_state);
  }
  else {
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,multi_purpose_string_state);
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t initial_state(MetaConfiguration &conf, std::ifstream &f,
                         int &error) {
  clear_empty(f);

  char c = f.peek();
  qCDebug(parser) << "Peeking" << c;
  switch (c) {
  case '#':
    return state_include;
  case '{':
    return begin_class_state;
  // case '[' : return begin_array_state;
  case '/':
    return guess_documentation_state;
  case EOF:
    return nullptr;
  default:
    return multi_purpose_string_state;
  }
  return nullptr;
}